

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O2

int P_FindTerrain(FName *name)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0xffffffff;
  if (name->Index != 1) {
    uVar2 = 0;
    while ((uVar1 = 0xffffffff, Terrains.Count != uVar2 &&
           (uVar1 = uVar2, Terrains.Array[uVar2].Name.Index != name->Index))) {
      uVar2 = uVar2 + 1;
    }
  }
  return uVar1;
}

Assistant:

bool operator == (ENamedName index) const { return Index == index; }